

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O3

void __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::ExtWrenchesAndJointTorquesEstimator
          (ExtWrenchesAndJointTorquesEstimator *this)

{
  iDynTree::Model::Model(&this->m_model);
  iDynTree::SubModelDecomposition::SubModelDecomposition(&this->m_submodels);
  this->m_isModelValid = false;
  this->m_isKinematicsUpdated = false;
  iDynTree::Traversal::Traversal(&this->m_dynamicTraversal);
  iDynTree::LinkTraversalsCache::LinkTraversalsCache(&this->m_kinematicTraversals);
  iDynTree::JointPosDoubleArray::JointPosDoubleArray(&this->m_jointPos,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&this->m_jointVel,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&this->m_jointAcc,0);
  iDynTree::LinkVelArray::LinkVelArray(&this->m_linkVels,0);
  iDynTree::LinkAccArray::LinkAccArray(&this->m_linkProperAccs,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_linkNetExternalWrenches,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_linkIntWrenches,0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            (&this->m_generalizedTorques);
  estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(&this->m_calibBufs);
  estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(&this->m_bufs);
  return;
}

Assistant:

ExtWrenchesAndJointTorquesEstimator::ExtWrenchesAndJointTorquesEstimator():
    m_model(),
    m_submodels(),
    m_isModelValid(false),
    m_isKinematicsUpdated(false),
    m_dynamicTraversal(),
    m_kinematicTraversals(),
    m_jointPos(),
    m_jointVel(),
    m_jointAcc(),
    m_linkVels(),
    m_linkProperAccs(),
    m_linkNetExternalWrenches(),
    m_linkIntWrenches(),
    m_generalizedTorques(),
    m_calibBufs(),
    m_bufs()
{

}